

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# np_nes_fds.c
# Opt level: O0

void NES_FDS_SetRate(void *chip,UINT32 r)

{
  undefined8 local_30;
  double leak;
  double cutoff;
  NES_FDS *fds;
  UINT32 r_local;
  void *chip_local;
  
  *(UINT32 *)((long)chip + 8) = r;
  RC_SET_RATIO((RATIO_CNTR *)((long)chip + 0x280),*(UINT32 *)((long)chip + 0xc),
               *(UINT32 *)((long)chip + 8));
  local_30 = 0.0;
  if (0.0 < (double)*(int *)((long)chip + 0x20)) {
    local_30 = exp(((double)*(int *)((long)chip + 0x20) * -6.28318) /
                   (double)*(uint *)((long)chip + 8));
  }
  *(int *)((long)chip + 0x278) = (int)(local_30 * 4096.0);
  *(int *)((long)chip + 0x27c) = 0x1000 - *(int *)((long)chip + 0x278);
  return;
}

Assistant:

void NES_FDS_SetRate(void* chip, UINT32 r)
{
	NES_FDS* fds = (NES_FDS*)chip;
	double cutoff, leak;

	fds->rate = r;

	RC_SET_RATIO(&fds->tick_count, fds->clock, fds->rate);
	
	// configure lowpass filter
	cutoff = (double)fds->option[OPT_CUTOFF];
	leak = 0.0;
	if (cutoff > 0)
		leak = exp(-2.0 * 3.14159 * cutoff / fds->rate);
	fds->rc_k = (INT32)(leak * (double)(1<<RC_BITS));
	fds->rc_l = (1<<RC_BITS) - fds->rc_k;
}